

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall
sf::RenderTarget::setupDraw(RenderTarget *this,bool useVertexCache,RenderStates *states)

{
  bool bVar1;
  Uint64 local_38;
  Uint64 textureId;
  RenderStates *states_local;
  bool useVertexCache_local;
  RenderTarget *this_local;
  
  if (((this->m_cache).glStatesSet & 1U) == 0) {
    resetGLStates(this);
  }
  if (useVertexCache) {
    if ((((this->m_cache).enable & 1U) == 0) || (((this->m_cache).useVertexCache & 1U) == 0)) {
      glLoadIdentity();
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                         ,0x297,"glLoadIdentity()");
    }
  }
  else {
    applyTransform(this,&states->transform);
  }
  if ((((this->m_cache).enable & 1U) == 0) || (((this->m_cache).viewChanged & 1U) != 0)) {
    applyCurrentView(this);
  }
  if ((((this->m_cache).enable & 1U) == 0) ||
     (bVar1 = sf::operator!=(&states->blendMode,&(this->m_cache).lastBlendMode), bVar1)) {
    applyBlendMode(this,&states->blendMode);
  }
  if ((((this->m_cache).enable & 1U) == 0) ||
     ((states->texture != (Texture *)0x0 && ((states->texture->m_fboAttachment & 1U) != 0)))) {
    applyTexture(this,states->texture);
  }
  else {
    if (states->texture == (Texture *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = states->texture->m_cacheId;
    }
    if (local_38 != (this->m_cache).lastTextureId) {
      applyTexture(this,states->texture);
    }
  }
  if (states->shader != (Shader *)0x0) {
    applyShader(this,states->shader);
  }
  return;
}

Assistant:

void RenderTarget::setupDraw(bool useVertexCache, const RenderStates& states)
{
    // First set the persistent OpenGL states if it's the very first call
    if (!m_cache.glStatesSet)
        resetGLStates();

    if (useVertexCache)
    {
        // Since vertices are transformed, we must use an identity transform to render them
        if (!m_cache.enable || !m_cache.useVertexCache)
            glCheck(glLoadIdentity());
    }
    else
    {
        applyTransform(states.transform);
    }

    // Apply the view
    if (!m_cache.enable || m_cache.viewChanged)
        applyCurrentView();

    // Apply the blend mode
    if (!m_cache.enable || (states.blendMode != m_cache.lastBlendMode))
        applyBlendMode(states.blendMode);

    // Apply the texture
    if (!m_cache.enable || (states.texture && states.texture->m_fboAttachment))
    {
        // If the texture is an FBO attachment, always rebind it
        // in order to inform the OpenGL driver that we want changes
        // made to it in other contexts to be visible here as well
        // This saves us from having to call glFlush() in
        // RenderTextureImplFBO which can be quite costly
        // See: https://www.khronos.org/opengl/wiki/Memory_Model
        applyTexture(states.texture);
    }
    else
    {
        Uint64 textureId = states.texture ? states.texture->m_cacheId : 0;
        if (textureId != m_cache.lastTextureId)
            applyTexture(states.texture);
    }

    // Apply the shader
    if (states.shader)
        applyShader(states.shader);
}